

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::tracker_scrape_response
          (torrent *this,tracker_request *req,int complete,int incomplete,int downloaded,int param_5
          )

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  announce_entry *this_00;
  announce_endpoint *paVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  protocol_version hash_version;
  endpoint local_endpoint;
  protocol_version local_7d;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  data_union local_68;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_38;
  
  auVar10[0] = -((char)(req->info_hash).m_number._M_elems[0] ==
                (char)(this->m_info_hash).v1.m_number._M_elems[0]);
  auVar10[1] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 1) ==
                *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 1));
  auVar10[2] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 2) ==
                *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 2));
  auVar10[3] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 3) ==
                *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 3));
  auVar10[4] = -((char)(req->info_hash).m_number._M_elems[1] ==
                (char)(this->m_info_hash).v1.m_number._M_elems[1]);
  auVar10[5] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 5) ==
                *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 5));
  auVar10[6] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 6) ==
                *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 6));
  auVar10[7] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 7) ==
                *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 7));
  auVar10[8] = -((char)(req->info_hash).m_number._M_elems[2] ==
                (char)(this->m_info_hash).v1.m_number._M_elems[2]);
  auVar10[9] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 9) ==
                *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 9));
  auVar10[10] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 10) ==
                 *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 10));
  auVar10[0xb] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 0xb) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xb));
  auVar10[0xc] = -((char)(req->info_hash).m_number._M_elems[3] ==
                  (char)(this->m_info_hash).v1.m_number._M_elems[3]);
  auVar10[0xd] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 0xd) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xd));
  auVar10[0xe] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 0xe) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xe));
  auVar10[0xf] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 0xf) ==
                  *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xf));
  uVar8 = *(ulong *)((this->m_info_hash).v1.m_number._M_elems + 2) ^
          *(ulong *)((req->info_hash).m_number._M_elems + 2);
  uVar9 = *(ulong *)(this->m_info_hash).v1.m_number._M_elems ^
          *(ulong *)(req->info_hash).m_number._M_elems;
  uVar2 = (this->m_info_hash).v1.m_number._M_elems[4];
  uVar3 = (req->info_hash).m_number._M_elems[4];
  auVar11[0] = -((char)uVar3 == (char)uVar2);
  auVar11[1] = -((char)(uVar3 >> 8) == (char)(uVar2 >> 8));
  auVar11[2] = -((char)(uVar3 >> 0x10) == (char)(uVar2 >> 0x10));
  auVar11[3] = -((char)(uVar3 >> 0x18) == (char)(uVar2 >> 0x18));
  auVar11[4] = 0xff;
  auVar11[5] = 0xff;
  auVar11[6] = 0xff;
  auVar11[7] = 0xff;
  auVar11[8] = 0xff;
  auVar11[9] = 0xff;
  auVar11[10] = 0xff;
  auVar11[0xb] = 0xff;
  auVar11[0xc] = 0xff;
  auVar11[0xd] = 0xff;
  auVar11[0xe] = 0xff;
  auVar11[0xf] = 0xff;
  auVar11 = auVar11 & auVar10;
  local_7d = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff;
  local_7c = incomplete;
  local_78 = complete;
  local_74 = downloaded;
  local_70 = incomplete;
  local_6c = complete;
  this_00 = tracker_list::find_tracker(&this->m_trackers,&req->url);
  local_68._8_4_ = 0;
  local_68._12_4_ = 0;
  local_68._16_4_ = 0;
  local_68._20_4_ = 0;
  local_68.v6.sin6_scope_id = 0;
  local_68._0_8_ = 2;
  if (this_00 != (announce_entry *)0x0) {
    paVar7 = announce_entry::find_endpoint(this_00,&req->outgoing_socket);
    if (paVar7 != (announce_endpoint *)0x0) {
      uVar2 = uVar2 ^ uVar3;
      local_68._0_8_ = *(undefined8 *)&(paVar7->local_endpoint).impl_.data_;
      uVar4 = *(undefined8 *)((long)&(paVar7->local_endpoint).impl_.data_ + 8);
      uVar5 = *(undefined8 *)((long)&(paVar7->local_endpoint).impl_.data_ + 0x14);
      local_68._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&(paVar7->local_endpoint).impl_.data_ + 0xc) >> 0x20);
      local_68._20_4_ = (undefined4)uVar5;
      local_68.v6.sin6_scope_id = (uint32_t)((ulong)uVar5 >> 0x20);
      local_68._8_4_ = (undefined4)uVar4;
      local_68._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      if (-1 < local_7c) {
        (paVar7->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [(uVar9 != 0 || uVar2 != 0) || uVar8 != 0].scrape_incomplete = local_7c;
      }
      if (-1 < local_78) {
        (paVar7->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [(uVar9 != 0 || uVar2 != 0) || uVar8 != 0].scrape_complete = local_78;
      }
      if (-1 < local_74) {
        (paVar7->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [(uVar9 != 0 || uVar2 != 0) || uVar8 != 0].scrape_downloaded = local_74;
      }
      update_scrape_state(this);
    }
  }
  iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if (((*(uint *)(CONCAT44(extraout_var,iVar6) + 0x68) & 0x10) != 0) ||
     (req->triggered_manually == true)) {
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xffffffffffffffc0);
    alert_manager::
    emplace_alert<libtorrent::scrape_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int_const&,int_const&,std::__cxx11::string_const&,libtorrent::protocol_version_const&>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar6),
               (torrent_handle *)&stack0xffffffffffffffc0,
               (basic_endpoint<boost::asio::ip::tcp> *)&local_68.base,&local_70,&local_6c,&req->url,
               &local_7d);
    if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         )local_38._M_head_impl !=
        (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         )0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)local_38._M_head_impl + 0xc);
        iVar6 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar6 = *(int *)((long)local_38._M_head_impl + 0xc);
        *(int *)((long)local_38._M_head_impl + 0xc) = iVar6 + -1;
      }
      if (iVar6 == 1) {
        (**(code **)(*(long *)local_38._M_head_impl + 0x18))();
      }
    }
  }
  return;
}

Assistant:

void torrent::tracker_scrape_response(tracker_request const& req
		, int const complete, int const incomplete, int const downloaded, int /* downloaders */)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;
		TORRENT_ASSERT(req.kind & tracker_request::scrape_request);

		protocol_version const hash_version = req.info_hash == m_info_hash.v1
			? protocol_version::V1 : protocol_version::V2;

		aux::announce_entry* ae = m_trackers.find_tracker(req.url);
		tcp::endpoint local_endpoint;
		if (ae)
		{
			auto* aep = ae->find_endpoint(req.outgoing_socket);
			if (aep)
			{
				local_endpoint = aep->local_endpoint;
				if (incomplete >= 0) aep->info_hashes[hash_version].scrape_incomplete = incomplete;
				if (complete >= 0) aep->info_hashes[hash_version].scrape_complete = complete;
				if (downloaded >= 0) aep->info_hashes[hash_version].scrape_downloaded = downloaded;

				update_scrape_state();
			}
		}

		// if this was triggered manually we need to post this unconditionally,
		// since the client expects a response from its action, regardless of
		// whether all tracker events have been enabled by the alert mask
		if (m_ses.alerts().should_post<scrape_reply_alert>()
			|| req.triggered_manually)
		{
			m_ses.alerts().emplace_alert<scrape_reply_alert>(
				get_handle(), local_endpoint, incomplete, complete, req.url, hash_version);
		}
	}